

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> * __thiscall
helics::HandleManager::regexSearch(HandleManager *this,string *regexExpression,InterfaceType type)

{
  bool bVar1;
  flag_type __f;
  reference this_00;
  InterfaceType in_CL;
  HandleManager *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  regex_error *re;
  BasicHandleInfo *handle;
  value_type *mres;
  const_iterator __end2;
  const_iterator __begin2;
  MapType *__range2;
  regex rgx;
  string rex;
  MapType *imap;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *matches;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
  *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  match_flag_type in_stack_ffffffffffffff14;
  BasicHandleInfo *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_98;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_90;
  MapType *local_88;
  undefined4 local_40;
  byte local_29;
  MapType *local_28;
  
  __pos = in_RDI;
  local_28 = getMap(in_RSI,in_CL);
  local_29 = 0;
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x566879);
  __f = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(size_type)__pos,
                (size_type)in_RSI,(char *)in_RDI);
  if (__f == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_RDI,CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
               (size_type)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff27 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (char *)in_stack_ffffffffffffff08);
    if ((bool)in_stack_ffffffffffffff27) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                (char *)in_stack_ffffffffffffff08);
    }
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,__f);
    local_88 = local_28;
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
         ::begin(in_stack_ffffffffffffff08);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
         ::end(in_stack_ffffffffffffff08);
    while (bVar1 = std::__detail::operator==(&local_90,&local_98), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::__detail::
                _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                ::operator*((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                             *)0x5669b6);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
      in_stack_ffffffffffffff26 =
           std::regex_match<char,std::__cxx11::regex_traits<char>>
                     ((char *)CONCAT17(in_stack_ffffffffffffff27,
                                       CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)
                                      ),
                      (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      if ((bool)in_stack_ffffffffffffff26) {
        in_stack_ffffffffffffff18 =
             getHandleInfo((HandleManager *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::push_back
                  ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                   &in_stack_ffffffffffffff18->handle);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_29 = 1;
    local_40 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  else {
    local_29 = 1;
    local_40 = 1;
  }
  if ((local_29 & 1) == 0) {
    std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~vector
              ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  }
  return (vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)in_RDI;
}

Assistant:

std::vector<GlobalHandle> HandleManager::regexSearch(const std::string& regexExpression,
                                                     InterfaceType type) const
{
    const auto& imap = getMap(type);
    std::vector<GlobalHandle> matches;
    if (regexExpression.compare(0, 6, "REGEX:") != 0) {
        return matches;
    }

    std::string rex = regexExpression.substr(6);
    if (rex == "*") {
        rex = ".*";
    }
    try {
        const std::regex rgx(rex);
        for (const auto& mres : imap) {
            if (std::regex_match(mres.first.data(), rgx)) {
                const auto* handle = getHandleInfo(mres.second);
                matches.push_back(handle->handle);
            }
        }
    }
    catch (const std::regex_error& re) {
        throw std::invalid_argument(re.what());
    }
    return matches;
}